

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomes.c
# Opt level: O0

int isOverworld(int mc,int id)

{
  int iVar1;
  int in_ESI;
  int in_EDI;
  bool local_12;
  bool local_11;
  uint local_4;
  
  iVar1 = biomeExists(in_EDI,in_ESI);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if ((in_ESI < 0x28) || (0x2b < in_ESI)) {
    if ((in_ESI < 0xaa) || (0xad < in_ESI)) {
      if (in_ESI - 8U < 2) {
        local_4 = 0;
      }
      else if (in_ESI == 10) {
        local_11 = in_EDI < 10 || 0xf < in_EDI;
        local_4 = (uint)local_11;
      }
      else if (in_ESI == 0x14) {
        local_4 = (uint)(in_EDI < 10);
      }
      else if ((in_ESI == 0x2f) || (in_ESI == 0x7f)) {
        local_4 = 0;
      }
      else if (in_ESI == 0x9b) {
        local_12 = in_EDI < 0xc || 0xd < in_EDI;
        local_4 = (uint)local_12;
      }
      else if (in_ESI - 0xaeU < 2) {
        local_4 = (uint)(0x15 < in_EDI);
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int isOverworld(int mc, int id)
{
    if (!biomeExists(mc, id))
        return 0;

    if (id >= small_end_islands && id <= end_barrens) return 0;
    if (id >= soul_sand_valley && id <= basalt_deltas) return 0;

    switch (id)
    {
    case nether_wastes:
    case the_end:
        return 0;
    case frozen_ocean:
        return mc <= MC_1_6 || mc >= MC_1_13;
    case mountain_edge:
        return mc <= MC_1_6;
    case deep_warm_ocean:
    case the_void:
        return 0;
    case tall_birch_forest:
        return mc <= MC_1_8 || mc >= MC_1_11;
    case dripstone_caves:
    case lush_caves:
        return mc >= MC_1_18;
    }
    return 1;
}